

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3Fts5ParserInit(void *fts5yypRawParser)

{
  fts5yyParser *fts5yypParser;
  void *fts5yypRawParser_local;
  
  *(long *)((long)fts5yypRawParser + 0x18) = (long)fts5yypRawParser + 0x20;
  *(long *)((long)fts5yypRawParser + 0x10) = *(long *)((long)fts5yypRawParser + 0x18) + 0x948;
  *(undefined8 *)fts5yypRawParser = *(undefined8 *)((long)fts5yypRawParser + 0x18);
  **(undefined1 **)((long)fts5yypRawParser + 0x18) = 0;
  *(undefined1 *)(*(long *)((long)fts5yypRawParser + 0x18) + 1) = 0;
  return;
}

Assistant:

static void sqlite3Fts5ParserInit(void *fts5yypRawParser sqlite3Fts5ParserCTX_PDECL){
  fts5yyParser *fts5yypParser = (fts5yyParser*)fts5yypRawParser;
  sqlite3Fts5ParserCTX_STORE
#ifdef fts5YYTRACKMAXSTACKDEPTH
  fts5yypParser->fts5yyhwm = 0;
#endif
  fts5yypParser->fts5yystack = fts5yypParser->fts5yystk0;
  fts5yypParser->fts5yystackEnd = &fts5yypParser->fts5yystack[fts5YYSTACKDEPTH-1];
#ifndef fts5YYNOERRORRECOVERY
  fts5yypParser->fts5yyerrcnt = -1;
#endif
  fts5yypParser->fts5yytos = fts5yypParser->fts5yystack;
  fts5yypParser->fts5yystack[0].stateno = 0;
  fts5yypParser->fts5yystack[0].major = 0;
}